

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UdpSocket.cpp
# Opt level: O2

void __thiscall SocketReceiveMultiplexer::Implementation::~Implementation(Implementation *this)

{
  close(this->breakPipe_[0]);
  close(this->breakPipe_[1]);
  std::_Vector_base<AttachedTimerListener,_std::allocator<AttachedTimerListener>_>::~_Vector_base
            (&(this->timerListeners_).
              super__Vector_base<AttachedTimerListener,_std::allocator<AttachedTimerListener>_>);
  std::
  _Vector_base<std::pair<PacketListener_*,_UdpSocket_*>,_std::allocator<std::pair<PacketListener_*,_UdpSocket_*>_>_>
  ::~_Vector_base((_Vector_base<std::pair<PacketListener_*,_UdpSocket_*>,_std::allocator<std::pair<PacketListener_*,_UdpSocket_*>_>_>
                   *)this);
  return;
}

Assistant:

~Implementation()
	{
		close( breakPipe_[0] );
		close( breakPipe_[1] );
	}